

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printStructs(PrinterStream *this)

{
  Structure *s_00;
  RefCountedPtr<soul::Structure> *s;
  RefCountedPtr<soul::Structure> *this_00;
  long lVar1;
  
  this_00 = (this->module->structs).structs.items;
  for (lVar1 = (this->module->structs).structs.numActive << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    s_00 = RefCountedPtr<soul::Structure>::operator*(this_00);
    printStruct(this,s_00);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void printStructs()
        {
            for (auto& s : module.structs.get())
                printStruct (*s);
        }